

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Store::Mark(Store *this,Ref ref)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  int iVar1;
  Object **ppOVar2;
  reference rVar3;
  size_t index;
  size_t local_20;
  
  this_00 = &(this->gc_context_).marks;
  local_20 = ref.index;
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,ref.index);
  if ((*rVar3._M_p & rVar3._M_mask) == 0) {
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,ref.index);
    *rVar3._M_p = *rVar3._M_p | rVar3._M_mask;
    iVar1 = (this->gc_context_).call_depth;
    if (iVar1 < 10) {
      (this->gc_context_).call_depth = iVar1 + 1;
      ppOVar2 = FreeList<wabt::interp::Object_*>::Get(&this->objects_,local_20);
      (*(*ppOVar2)->_vptr_Object[2])(*ppOVar2,this);
      (this->gc_context_).call_depth = (this->gc_context_).call_depth + -1;
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&(this->gc_context_).untraced_objects,&local_20);
    }
  }
  return;
}

Assistant:

void Store::Mark(Ref ref) {
  size_t index = ref.index;

  if (gc_context_.marks[index])
    return;

  gc_context_.marks[index] = true;

  if (WABT_UNLIKELY(gc_context_.call_depth >= max_call_depth)) {
    gc_context_.untraced_objects.push_back(index);
    return;
  }

  gc_context_.call_depth++;
  objects_.Get(index)->Mark(*this);
  gc_context_.call_depth--;
}